

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void dropColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  RenameToken **ppRVar1;
  short sVar2;
  sqlite3 *db;
  sqlite3_xauth p_Var3;
  int iVar4;
  i64 iVar5;
  char *zSql;
  i64 iVar6;
  RenameToken *pRVar7;
  char *pcVar8;
  char *pcVar9;
  long in_FS_OFFSET;
  Parse sParse;
  Parse local_1e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = context->pOut->db;
  iVar5 = sqlite3VdbeIntValue(*argv);
  zSql = (char *)sqlite3ValueText(argv[1],'\x01');
  iVar6 = sqlite3VdbeIntValue(argv[2]);
  pcVar8 = db->aDb[(int)iVar5].zDbSName;
  memset(&local_1e0,0xaa,0x1a8);
  p_Var3 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  iVar4 = renameParseSql(&local_1e0,pcVar8,db,zSql,(uint)((int)iVar5 == 1));
  if (iVar4 == 0) {
    if (local_1e0.pNewTable != (Table *)0x0) {
      sVar2 = (local_1e0.pNewTable)->nCol;
      iVar4 = (int)iVar6;
      if (sVar2 != 1 && iVar4 < sVar2) {
        pcVar8 = (local_1e0.pNewTable)->aCol[iVar4].zCnName;
        pRVar7 = local_1e0.pRename;
        if (local_1e0.pRename == (RenameToken *)0x0 || pcVar8 == (char *)0x0) {
          pRVar7 = (RenameToken *)0x0;
        }
        else {
          do {
            if ((char *)pRVar7->p == pcVar8) goto LAB_001b26f9;
            ppRVar1 = &pRVar7->pNext;
            pRVar7 = *ppRVar1;
          } while (*ppRVar1 != (RenameToken *)0x0);
          pRVar7 = (RenameToken *)0x0;
        }
LAB_001b26f9:
        if (iVar4 < sVar2 + -1) {
          pcVar8 = (char *)(local_1e0.pRename)->p;
          while (pcVar8 != (local_1e0.pNewTable)->aCol[(long)iVar4 + 1].zCnName) {
            local_1e0.pRename = (local_1e0.pRename)->pNext;
            pcVar8 = (char *)(local_1e0.pRename)->p;
          }
          pcVar8 = ((local_1e0.pRename)->t).z;
          pcVar9 = (pRVar7->t).z;
        }
        else {
          pcVar8 = zSql + ((local_1e0.pNewTable)->u).tab.addColOffset;
          pcVar9 = (pRVar7->t).z;
          while ((*pcVar9 != '\0' && (*pcVar9 != ','))) {
            pcVar9 = pcVar9 + -1;
            (pRVar7->t).z = pcVar9;
          }
        }
        pcVar8 = sqlite3MPrintf(db,"%.*s%s",(long)pcVar9 - (long)zSql,zSql,pcVar8);
        setResultStrOrError(context,pcVar8,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3_free(pcVar8);
        renameParseCleanup(&local_1e0);
        db->xAuth = p_Var3;
        goto LAB_001b26ba;
      }
    }
    iVar4 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1d103,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  renameParseCleanup(&local_1e0);
  db->xAuth = p_Var3;
  sqlite3_result_error_code(context,iVar4);
LAB_001b26ba:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void dropColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  int iSchema = sqlite3_value_int(argv[0]);
  const char *zSql = (const char*)sqlite3_value_text(argv[1]);
  int iCol = sqlite3_value_int(argv[2]);
  const char *zDb = db->aDb[iSchema].zDbSName;
  int rc;
  Parse sParse;
  RenameToken *pCol;
  Table *pTab;
  const char *zEnd;
  char *zNew = 0;

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  rc = renameParseSql(&sParse, zDb, db, zSql, iSchema==1);
  if( rc!=SQLITE_OK ) goto drop_column_done;
  pTab = sParse.pNewTable;
  if( pTab==0 || pTab->nCol==1 || iCol>=pTab->nCol ){
    /* This can happen if the sqlite_schema table is corrupt */
    rc = SQLITE_CORRUPT_BKPT;
    goto drop_column_done;
  }

  pCol = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol].zCnName);
  if( iCol<pTab->nCol-1 ){
    RenameToken *pEnd;
    pEnd = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol+1].zCnName);
    zEnd = (const char*)pEnd->t.z;
  }else{
    assert( IsOrdinaryTable(pTab) );
    zEnd = (const char*)&zSql[pTab->u.tab.addColOffset];
    while( ALWAYS(pCol->t.z[0]!=0) && pCol->t.z[0]!=',' ) pCol->t.z--;
  }

  zNew = sqlite3MPrintf(db, "%.*s%s", pCol->t.z-zSql, zSql, zEnd);
  sqlite3_result_text(context, zNew, -1, SQLITE_TRANSIENT);
  sqlite3_free(zNew);

drop_column_done:
  renameParseCleanup(&sParse);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(context, rc);
  }
}